

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGjkPairDetector.cpp
# Opt level: O0

void __thiscall
btGjkPairDetector::btGjkPairDetector
          (btGjkPairDetector *this,btConvexShape *objectA,btConvexShape *objectB,int shapeTypeA,
          int shapeTypeB,btScalar marginA,btScalar marginB,btVoronoiSimplexSolver *simplexSolver,
          btConvexPenetrationDepthSolver *penetrationDepthSolver)

{
  undefined4 in_ECX;
  _func_int **in_RDX;
  _func_int **in_RSI;
  btDiscreteCollisionDetectorInterface *in_RDI;
  undefined4 in_R8D;
  _func_int **in_R9;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM1_Da;
  _func_int **in_stack_00000008;
  btScalar local_3c;
  btScalar local_38;
  btScalar local_34;
  _func_int **local_30;
  undefined4 local_28;
  undefined4 local_24;
  undefined4 local_20;
  undefined4 local_1c;
  _func_int **local_18;
  _func_int **local_10;
  
  local_30 = in_R9;
  local_28 = in_XMM1_Da;
  local_24 = in_XMM0_Da;
  local_20 = in_R8D;
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  btDiscreteCollisionDetectorInterface::btDiscreteCollisionDetectorInterface(in_RDI);
  in_RDI->_vptr_btDiscreteCollisionDetectorInterface =
       (_func_int **)&PTR__btGjkPairDetector_002e6af0;
  local_34 = 0.0;
  local_38 = 1.0;
  local_3c = 0.0;
  btVector3::btVector3((btVector3 *)(in_RDI + 1),&local_34,&local_38,&local_3c);
  in_RDI[3]._vptr_btDiscreteCollisionDetectorInterface = in_stack_00000008;
  in_RDI[4]._vptr_btDiscreteCollisionDetectorInterface = local_30;
  in_RDI[5]._vptr_btDiscreteCollisionDetectorInterface = local_10;
  in_RDI[6]._vptr_btDiscreteCollisionDetectorInterface = local_18;
  *(undefined4 *)&in_RDI[7]._vptr_btDiscreteCollisionDetectorInterface = local_1c;
  *(undefined4 *)((long)&in_RDI[7]._vptr_btDiscreteCollisionDetectorInterface + 4) = local_20;
  *(undefined4 *)&in_RDI[8]._vptr_btDiscreteCollisionDetectorInterface = local_24;
  *(undefined4 *)((long)&in_RDI[8]._vptr_btDiscreteCollisionDetectorInterface + 4) = local_28;
  *(undefined1 *)&in_RDI[9]._vptr_btDiscreteCollisionDetectorInterface = 0;
  *(undefined4 *)&in_RDI[10]._vptr_btDiscreteCollisionDetectorInterface = 0xffffffff;
  *(undefined4 *)((long)&in_RDI[0xb]._vptr_btDiscreteCollisionDetectorInterface + 4) = 1;
  *(undefined4 *)&in_RDI[0xc]._vptr_btDiscreteCollisionDetectorInterface = 1;
  return;
}

Assistant:

btGjkPairDetector::btGjkPairDetector(const btConvexShape* objectA,const btConvexShape* objectB,int shapeTypeA,int shapeTypeB,btScalar marginA, btScalar marginB, btSimplexSolverInterface* simplexSolver,btConvexPenetrationDepthSolver*	penetrationDepthSolver)
:m_cachedSeparatingAxis(btScalar(0.),btScalar(1.),btScalar(0.)),
m_penetrationDepthSolver(penetrationDepthSolver),
m_simplexSolver(simplexSolver),
m_minkowskiA(objectA),
m_minkowskiB(objectB),
m_shapeTypeA(shapeTypeA),
m_shapeTypeB(shapeTypeB),
m_marginA(marginA),
m_marginB(marginB),
m_ignoreMargin(false),
m_lastUsedMethod(-1),
m_catchDegeneracies(1),
m_fixContactNormalDirection(1)
{
}